

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathBezierQuadraticCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,int num_segments)

{
  ImVec2 *pIVar1;
  int in_ECX;
  undefined8 in_RSI;
  ImVector<ImVec2> *in_RDI;
  float fVar2;
  ImVec2 IVar3;
  float unaff_retaddr;
  float unaff_retaddr_00;
  float in_stack_00000008;
  float in_stack_0000000c;
  ImVector<ImVec2> *in_stack_00000010;
  int i_step;
  float t_step;
  ImVec2 p1;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  int iVar4;
  float fVar5;
  ImVector<ImVec2> *pIVar6;
  
  pIVar6 = in_RDI;
  pIVar1 = ImVector<ImVec2>::back((ImVector<ImVec2> *)&in_RDI[7].Data);
  fVar5 = (*pIVar1).x;
  if (in_ECX == 0) {
    PathBezierQuadraticCurveToCasteljau
              (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
               (float)((ulong)pIVar6 >> 0x20),SUB84(pIVar6,0),(float)((ulong)in_RSI >> 0x20),
               (int)in_RSI);
  }
  else {
    fVar2 = 1.0 / (float)in_ECX;
    for (iVar4 = 1; iVar4 <= in_ECX; iVar4 = iVar4 + 1) {
      pIVar1 = (ImVec2 *)&in_RDI[7].Data;
      IVar3 = ImBezierQuadraticCalc
                        ((ImVec2 *)CONCAT44(fVar5,fVar2),
                         (ImVec2 *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                         (ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (float)((ulong)in_RDI >> 0x20));
      in_stack_ffffffffffffffcc = IVar3.x;
      in_stack_ffffffffffffffd0 = IVar3.y;
      ImVector<ImVec2>::push_back(in_RDI,pIVar1);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathBezierQuadraticCurveTo(const ImVec2& p2, const ImVec2& p3, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierQuadraticCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, _Data->CurveTessellationTol, 0);// Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierQuadraticCalc(p1, p2, p3, t_step * i_step));
    }
}